

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O1

void __thiscall
iDynTree::Visualizer::subDraw
          (Visualizer *this,int xOffsetFromTopLeft,int yOffsetFromTopLeft,int subImageWidth,
          int subImageHeight)

{
  iDynTree::reportError
            ("Visualizer","subDraw",
             "Impossible to use iDynTree::Visualizer, as iDynTree has been compiled without Irrlicht."
            );
  return;
}

Assistant:

void Visualizer::subDraw(int xOffsetFromTopLeft, int yOffsetFromTopLeft, int subImageWidth, int subImageHeight)
{
#ifdef IDYNTREE_USES_IRRLICHT
    if( !pimpl->m_isInitialized )
    {
        reportError("Visualizer","subDraw","Impossible to run not initialized visualizer");
        return;
    }

    if (xOffsetFromTopLeft + subImageWidth > width())
    {
        reportError("Visualizer","subDraw","The specified draw coordinates are out of bounds. The sum of the xOffsetFromTopLeft and width are greater than the window width.");
        return;
    }

    if (yOffsetFromTopLeft + subImageHeight > height())
    {
        reportError("Visualizer","subDraw","The specified draw coordinates are out of bounds. The sum of the yOffsetFromTopLeft and height are greater than the window height.");
        return;
    }

    if (subImageHeight <= 0)
    {
        return;
    }

    bool clearTextureBuffers = false;
    if (!pimpl->m_subDrawStarted)
    {
#ifdef IDYNTREE_USE_GLFW_WINDOW
        glfwMakeContextCurrent(pimpl->m_window);
#endif
        pimpl->m_irrDriver->beginScene(true,true, pimpl->m_environment.m_backgroundColor.toSColor(), pimpl->m_irrVideoData);
        pimpl->m_subDrawStarted = true;
        clearTextureBuffers = true;
    }

    pimpl->m_textures.draw(pimpl->m_environment, pimpl->m_camera, clearTextureBuffers);

    pimpl->m_camera.setAspectRatio(subImageWidth/ (float)subImageHeight);

    int winWidth = width();
    int winHeight = height();
    pimpl->m_irrDriver->OnResize(irr::core::dimension2d<irr::u32>(winWidth, winHeight));
    pimpl->m_irrDriver->setViewPort(irr::core::rect<irr::s32>(0, 0, winWidth, winHeight)); //workaround for http://irrlicht.sourceforge.net/forum/viewtopic.php?f=7&t=47004
    pimpl->m_irrDriver->setViewPort(irr::core::rect<irr::s32>(xOffsetFromTopLeft, yOffsetFromTopLeft,
                                                              xOffsetFromTopLeft + subImageWidth, yOffsetFromTopLeft + subImageHeight));

    pimpl->m_irrSmgr->drawAll();

#else
    reportError("Visualizer","subDraw","Impossible to use iDynTree::Visualizer, as iDynTree has been compiled without Irrlicht.");
#endif
}